

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

DdNode * extraTransferPermuteRecur
                   (DdManager *ddS,DdManager *ddD,DdNode *f,st__table *table,int *Permute)

{
  int *piVar1;
  st__table *table_00;
  int iVar2;
  uint *puVar3;
  DdNode *g;
  DdNode *h;
  DdNode *f_00;
  long lVar4;
  ulong uVar5;
  uint *key;
  DdNode *res;
  timespec ts;
  DdNode *local_68;
  st__table *local_60;
  uint local_54;
  timespec local_50;
  DdNode *local_40;
  DdNode *local_38;
  
  local_38 = ddD->one;
  key = (uint *)((ulong)f & 0xfffffffffffffffe);
  uVar5 = (ulong)((uint)f & 1);
  if (*key == 0x7fffffff) {
    return (DdNode *)(uVar5 ^ (ulong)local_38);
  }
  iVar2 = st__lookup(table,(char *)key,(char **)&local_68);
  if (iVar2 == 0) {
    local_60 = table;
    if (ddS->TimeStop != 0) {
      iVar2 = clock_gettime(3,&local_50);
      if (iVar2 < 0) {
        lVar4 = -1;
      }
      else {
        lVar4 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      if (ddS->TimeStop < lVar4) {
        return (DdNode *)0x0;
      }
    }
    if (ddD->TimeStop != 0) {
      iVar2 = clock_gettime(3,&local_50);
      if (iVar2 < 0) {
        lVar4 = -1;
      }
      else {
        lVar4 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      if (ddD->TimeStop < lVar4) {
        return (DdNode *)0x0;
      }
    }
    table_00 = local_60;
    puVar3 = key;
    if (Permute != (int *)0x0) {
      puVar3 = (uint *)(Permute + *key);
    }
    local_54 = *puVar3;
    local_40 = *(DdNode **)(key + 6);
    g = extraTransferPermuteRecur(ddS,ddD,*(DdNode **)(key + 4),local_60,Permute);
    if (g != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      h = extraTransferPermuteRecur(ddS,ddD,local_40,table_00,Permute);
      if (h != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        f_00 = cuddUniqueInter(ddD,local_54,local_38,(DdNode *)((ulong)ddD->one ^ 1));
        if ((f_00 == (DdNode *)0x0) ||
           (local_68 = cuddBddIteRecur(ddD,f_00,g,h), local_68 == (DdNode *)0x0)) {
          Cudd_RecursiveDeref(ddD,g);
          g = h;
        }
        else {
          piVar1 = (int *)(((ulong)local_68 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(ddD,g);
          Cudd_RecursiveDeref(ddD,h);
          iVar2 = st__add_direct(local_60,(char *)key,(char *)local_68);
          g = local_68;
          if (iVar2 != -10000) {
            return (DdNode *)(uVar5 ^ (ulong)local_68);
          }
        }
      }
      Cudd_RecursiveDeref(ddD,g);
    }
    return (DdNode *)0x0;
  }
  return (DdNode *)(uVar5 ^ (ulong)local_68);
}

Assistant:

static DdNode * 
extraTransferPermuteRecur( 
  DdManager * ddS, 
  DdManager * ddD, 
  DdNode * f, 
  st__table * table, 
  int * Permute )
{
    DdNode *ft, *fe, *t, *e, *var, *res;
    DdNode *one, *zero;
    int index;
    int comple = 0;

    statLine( ddD );
    one = DD_ONE( ddD );
    comple = Cudd_IsComplement( f );

    /* Trivial cases. */
    if ( Cudd_IsConstant( f ) )
        return ( Cudd_NotCond( one, comple ) );


    /* Make canonical to increase the utilization of the cache. */
    f = Cudd_NotCond( f, comple );
    /* Now f is a regular pointer to a non-constant node. */

    /* Check the cache. */
    if ( st__lookup( table, ( char * ) f, ( char ** ) &res ) )
        return ( Cudd_NotCond( res, comple ) );

    if ( ddS->TimeStop && Abc_Clock() > ddS->TimeStop )
        return NULL;
    if ( ddD->TimeStop && Abc_Clock() > ddD->TimeStop )
        return NULL;

    /* Recursive step. */
    if ( Permute )
        index = Permute[f->index];
    else
        index = f->index;

    ft = cuddT( f );
    fe = cuddE( f );

    t = extraTransferPermuteRecur( ddS, ddD, ft, table, Permute );
    if ( t == NULL )
    {
        return ( NULL );
    }
    cuddRef( t );

    e = extraTransferPermuteRecur( ddS, ddD, fe, table, Permute );
    if ( e == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        return ( NULL );
    }
    cuddRef( e );

    zero = Cudd_Not(ddD->one);
    var = cuddUniqueInter( ddD, index, one, zero );
    if ( var == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        Cudd_RecursiveDeref( ddD, e );
        return ( NULL );
    }
    res = cuddBddIteRecur( ddD, var, t, e );

    if ( res == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        Cudd_RecursiveDeref( ddD, e );
        return ( NULL );
    }
    cuddRef( res );
    Cudd_RecursiveDeref( ddD, t );
    Cudd_RecursiveDeref( ddD, e );

    if ( st__add_direct( table, ( char * ) f, ( char * ) res ) ==
         st__OUT_OF_MEM )
    {
        Cudd_RecursiveDeref( ddD, res );
        return ( NULL );
    }
    return ( Cudd_NotCond( res, comple ) );

}